

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_tile_obu_size(AV1_COMP *cpi,uint8_t *dst,aom_write_bit_buffer *saved_wb,
                        int largest_tile_id,uint32_t *total_size,uint max_tile_size,
                        uint32_t obu_header_size,uint8_t *tile_data_start)

{
  uint32_t data_size;
  int iVar1;
  CommonTileParams *tiles_00;
  uint8_t *coded_value;
  undefined4 in_ECX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  size_t dst_offset;
  size_t src_offset;
  size_t new_length_field_size;
  uint64_t new_payload_size;
  int res;
  size_t length_field_size;
  uint64_t payload_size;
  uint32_t tile_data_size;
  uint32_t tile_data_offset;
  int unused;
  int tile_size_bytes;
  CommonTileParams *tiles;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 *puVar2;
  aom_write_bit_buffer *in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffa8;
  undefined4 local_50;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  
  tiles_00 = (CommonTileParams *)(in_RDI + 0x42020);
  aom_wb_overwrite_literal
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (int)in_stack_ffffffffffffff78);
  if (*(int *)(in_RDI + 0x9d4c4) == 1) {
    data_size = (int)src_offset - (int)in_RSI;
    puVar2 = &stack0xffffffffffffffc0;
    iVar1 = remux_tiles(tiles_00,(uint8_t *)CONCAT44(4,in_stack_ffffffffffffffc0),data_size,
                        *in_R8 - data_size,in_stack_ffffffffffffffb4,
                        (int *)in_stack_ffffffffffffffa8,
                        (int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    *in_R8 = iVar1;
    *in_R8 = data_size + *in_R8;
    aom_wb_overwrite_literal(in_stack_ffffffffffffff80,(int)((ulong)puVar2 >> 0x20),(int)puVar2);
    iVar1 = aom_uleb_decode((uint8_t *)(in_RSI + (ulong)(uint)dst_offset),
                            (ulong)(*in_R8 - (uint)dst_offset),(uint64_t *)&local_50,
                            (size_t *)&stack0xffffffffffffffa8);
    coded_value = (uint8_t *)((ulong)(*in_R8 - (uint)dst_offset) - (long)in_stack_ffffffffffffffa8);
    if ((coded_value != (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,local_50)) &&
       (aom_uleb_encode((uint64_t)in_stack_ffffffffffffffa8,
                        CONCAT44(iVar1,in_stack_ffffffffffffffa0),coded_value,
                        in_stack_ffffffffffffff90),
       in_stack_ffffffffffffff90 < in_stack_ffffffffffffffa8)) {
      memmove((void *)((long)in_stack_ffffffffffffff90 + in_RSI + (ulong)(uint)dst_offset),
              (void *)((long)in_stack_ffffffffffffffa8 + in_RSI + (ulong)(uint)dst_offset),
              CONCAT44(in_stack_ffffffffffffffb4,local_50));
      *in_R8 = *in_R8 - ((int)in_stack_ffffffffffffffa8 - (int)in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

static void write_tile_obu_size(AV1_COMP *const cpi, uint8_t *const dst,
                                struct aom_write_bit_buffer *saved_wb,
                                int largest_tile_id, uint32_t *const total_size,
                                unsigned int max_tile_size,
                                uint32_t obu_header_size,
                                uint8_t *tile_data_start) {
  const CommonTileParams *const tiles = &cpi->common.tiles;

  // Fill in context_update_tile_id indicating the tile to use for the
  // cdf update. The encoder currently sets it to the largest tile
  // (but is up to the encoder)
  aom_wb_overwrite_literal(saved_wb, largest_tile_id,
                           (tiles->log2_cols + tiles->log2_rows));
  // If more than one tile group. tile_size_bytes takes the default value 4
  // and does not need to be set. For a single tile group it is set in the
  // section below.
  if (cpi->num_tg != 1) return;
  int tile_size_bytes = 4, unused;
  const uint32_t tile_data_offset = (uint32_t)(tile_data_start - dst);
  const uint32_t tile_data_size = *total_size - tile_data_offset;

  *total_size = remux_tiles(tiles, tile_data_start, tile_data_size,
                            max_tile_size, 0, &tile_size_bytes, &unused);
  *total_size += tile_data_offset;
  assert(tile_size_bytes >= 1 && tile_size_bytes <= 4);

  aom_wb_overwrite_literal(saved_wb, tile_size_bytes - 1, 2);

  // Update the OBU length if remux_tiles() reduced the size.
  uint64_t payload_size;
  size_t length_field_size;
  int res =
      aom_uleb_decode(dst + obu_header_size, *total_size - obu_header_size,
                      &payload_size, &length_field_size);
  assert(res == 0);
  (void)res;

  const uint64_t new_payload_size =
      *total_size - obu_header_size - length_field_size;
  if (new_payload_size != payload_size) {
    size_t new_length_field_size;
    res = aom_uleb_encode(new_payload_size, length_field_size,
                          dst + obu_header_size, &new_length_field_size);
    assert(res == 0);
    if (new_length_field_size < length_field_size) {
      const size_t src_offset = obu_header_size + length_field_size;
      const size_t dst_offset = obu_header_size + new_length_field_size;
      memmove(dst + dst_offset, dst + src_offset, (size_t)payload_size);
      *total_size -= (int)(length_field_size - new_length_field_size);
    }
  }
}